

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moment_suite.cpp
# Opt level: O2

void skewness_api_suite::run(void)

{
  test_ctor();
  test_clear();
  test_capacity();
  test_size();
  test_empty();
  test_full();
  return;
}

Assistant:

void run()
{
    test_ctor();
    test_clear();
    test_capacity();
    test_size();
    test_empty();
    test_full();
}